

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ComputeCumulativeSumRow_C(uint8_t *row,int32_t *cumsum,int32_t *previous_cumsum,int width)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (0 < width) {
    lVar1 = 0;
    iVar2 = 0;
    iVar3 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)row[lVar1];
      iVar4 = iVar4 + (uint)row[lVar1 + 1];
      iVar3 = iVar3 + (uint)row[lVar1 + 2];
      iVar2 = iVar2 + (uint)row[lVar1 + 3];
      cumsum[lVar1] = previous_cumsum[lVar1] + iVar5;
      cumsum[lVar1 + 1] = previous_cumsum[lVar1 + 1] + iVar4;
      cumsum[lVar1 + 2] = previous_cumsum[lVar1 + 2] + iVar3;
      cumsum[lVar1 + 3] = previous_cumsum[lVar1 + 3] + iVar2;
      lVar1 = lVar1 + 4;
    } while ((ulong)(uint)width << 2 != lVar1);
  }
  return;
}

Assistant:

void ComputeCumulativeSumRow_C(const uint8_t* row,
                               int32_t* cumsum,
                               const int32_t* previous_cumsum,
                               int width) {
  int32_t row_sum[4] = {0, 0, 0, 0};
  int x;
  for (x = 0; x < width; ++x) {
    row_sum[0] += row[x * 4 + 0];
    row_sum[1] += row[x * 4 + 1];
    row_sum[2] += row[x * 4 + 2];
    row_sum[3] += row[x * 4 + 3];
    cumsum[x * 4 + 0] = row_sum[0] + previous_cumsum[x * 4 + 0];
    cumsum[x * 4 + 1] = row_sum[1] + previous_cumsum[x * 4 + 1];
    cumsum[x * 4 + 2] = row_sum[2] + previous_cumsum[x * 4 + 2];
    cumsum[x * 4 + 3] = row_sum[3] + previous_cumsum[x * 4 + 3];
  }
}